

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::hugeint_t,double,duckdb::ArgMinMaxState<duckdb::hugeint_t,double>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_double> *state,hugeint_t x_data,double y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  long lVar2;
  ArgMinMaxBase<duckdb::LessThan,false> AVar3;
  double local_30;
  
  lVar2 = x_data.upper;
  if ((**(long **)(lVar2 + 0x10) != 0) &&
     ((*(ulong *)(**(long **)(lVar2 + 0x10) + (*(ulong *)(lVar2 + 0x20) >> 6) * 8) >>
       (*(ulong *)(lVar2 + 0x20) & 0x3f) & 1) == 0)) {
    return;
  }
  local_30 = y_data;
  bVar1 = GreaterThan::Operation<double>((double *)(this + 0x18),&local_30);
  if (!bVar1) {
    return;
  }
  if (**(long **)(lVar2 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    AVar3 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(lVar2 + 8) + (*(ulong *)(lVar2 + 0x18) >> 6) * 8) >>
              (*(ulong *)(lVar2 + 0x18) & 0x3f) & 1) == 0);
    this[1] = AVar3;
    if ((bool)AVar3) goto LAB_018a8a15;
  }
  *(ArgMinMaxState<duckdb::hugeint_t,_double> **)(this + 8) = state;
  *(uint64_t *)(this + 0x10) = x_data.lower;
LAB_018a8a15:
  *(double *)(this + 0x18) = local_30;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}